

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

void __thiscall
pbrt::StratifiedSampler::StratifiedSampler
          (StratifiedSampler *this,int xPixelSamples,int yPixelSamples,bool jitter,int seed)

{
  byte in_CL;
  int in_EDX;
  int in_ESI;
  Point2<int> *in_RDI;
  int in_R8D;
  
  (in_RDI->super_Tuple2<pbrt::Point2,_int>).x = in_ESI;
  (in_RDI->super_Tuple2<pbrt::Point2,_int>).y = in_EDX;
  *(byte *)&in_RDI[1].super_Tuple2<pbrt::Point2,_int>.x = in_CL & 1;
  in_RDI[1].super_Tuple2<pbrt::Point2,_int>.y = in_R8D;
  RNG::RNG((RNG *)(in_RDI + 2));
  Point2<int>::Point2(in_RDI);
  in_RDI[5].super_Tuple2<pbrt::Point2,_int>.x = 0;
  in_RDI[5].super_Tuple2<pbrt::Point2,_int>.y = 0;
  return;
}

Assistant:

StratifiedSampler(int xPixelSamples, int yPixelSamples, bool jitter, int seed = 0)
        : xPixelSamples(xPixelSamples),
          yPixelSamples(yPixelSamples),
          jitter(jitter),
          seed(seed) {}